

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::Bloaty::ScanAndRollupFiles
          (Bloaty *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *build_ids,Rollup *rollup)

{
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  int *piVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  type *__f;
  pointer regex_00;
  allocator_type *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RDI;
  string error;
  PerThreadData *data;
  int i_1;
  int i;
  unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> regex;
  ThreadSafeIterIndex index;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<PerThreadData,_std::allocator<PerThreadData>_> thread_data;
  int num_threads;
  int num_cpus;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  Rollup *in_stack_fffffffffffffe30;
  string *this_00;
  undefined4 in_stack_fffffffffffffe3c;
  int line;
  allocator_type *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  reference in_stack_fffffffffffffe50;
  ThreadSafeIterIndex *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  const_iterator __position;
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  reference local_128;
  int local_11c;
  reference local_118;
  undefined1 *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  int local_ec;
  undefined1 local_d8 [95];
  undefined1 local_79 [48];
  undefined1 local_49 [29];
  int local_2c;
  int local_28;
  int local_24 [3];
  allocator_type *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_24[0] = std::thread::hardware_concurrency();
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_10);
  local_2c = (int)sVar3;
  piVar4 = std::min<int>(local_24,&local_2c);
  local_28 = *piVar4;
  __first._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_28;
  __position._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  std::allocator<PerThreadData>::allocator((allocator<PerThreadData> *)0x178491);
  std::vector<PerThreadData,_std::allocator<PerThreadData>_>::vector
            ((vector<PerThreadData,_std::allocator<PerThreadData>_> *)in_stack_fffffffffffffe50,
             (size_type)in_stack_fffffffffffffe48,(allocator_type *)in_stack_fffffffffffffe40);
  std::allocator<PerThreadData>::~allocator((allocator<PerThreadData> *)0x1784b7);
  __f = (type *)(long)local_28;
  this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_79;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1784d6);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffe50,
             (size_type)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1784fc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(local_10);
  ThreadSafeIterIndex::ThreadSafeIterIndex
            ((ThreadSafeIterIndex *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>::
  unique_ptr<std::default_delete<bloaty::ReImpl>,void>
            ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)
             in_stack_fffffffffffffe30,
             (nullptr_t)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  uVar1 = Options::has_source_filter((Options *)0x178539);
  if ((bool)uVar1) {
    in_stack_fffffffffffffe58 =
         (ThreadSafeIterIndex *)Options::source_filter_abi_cxx11_((Options *)0x17855a);
    std::make_unique<bloaty::ReImpl,std::__cxx11::string_const&>(in_stack_fffffffffffffe48);
    std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::operator=
              ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)
               in_stack_fffffffffffffe30,
               (unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
              ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)
               in_stack_fffffffffffffe30);
  }
  for (local_ec = 0; local_ec < local_28; local_ec = local_ec + 1) {
    in_stack_fffffffffffffe50 =
         std::vector<PerThreadData,_std::allocator<PerThreadData>_>::operator[]
                   ((vector<PerThreadData,_std::allocator<PerThreadData>_> *)(local_49 + 1),
                    (long)local_ec);
    regex_00 = std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::get
                         ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)
                          in_stack_fffffffffffffe30);
    Rollup::SetFilterRegex(&in_stack_fffffffffffffe50->rollup,regex_00);
    local_108 = local_d8;
    local_100 = local_10;
    local_118 = std::vector<PerThreadData,_std::allocator<PerThreadData>_>::operator[]
                          ((vector<PerThreadData,_std::allocator<PerThreadData>_> *)(local_49 + 1),
                           (long)local_ec);
    std::thread::
    thread<bloaty::Bloaty::ScanAndRollupFiles(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,bloaty::Rollup*)const::__0,bloaty::Bloaty::ScanAndRollupFiles(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,bloaty::Rollup*)const::PerThreadData*,void>
              ((thread *)this_01,__f,(PerThreadData **)CONCAT17(uVar1,in_stack_fffffffffffffe60));
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)(local_79 + 1),(long)local_ec);
    std::thread::operator=
              ((thread *)in_stack_fffffffffffffe30,
               (thread *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::thread::~thread((thread *)0x178707);
  }
  for (local_11c = 0; local_11c < local_28; local_11c = local_11c + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)(local_79 + 1),(long)local_11c);
    std::thread::join();
    local_128 = std::vector<PerThreadData,_std::allocator<PerThreadData>_>::operator[]
                          ((vector<PerThreadData,_std::allocator<PerThreadData>_> *)(local_49 + 1),
                           (long)local_11c);
    if (local_11c == 0) {
      Rollup::operator=(in_stack_fffffffffffffe30,
                        (Rollup *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    else {
      Rollup::Add((Rollup *)__first._M_current,(Rollup *)in_RDI._M_current);
    }
    in_stack_fffffffffffffe40 = local_18;
    local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe30,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          (this_01,__position,__first,in_RDI);
  }
  this_00 = local_170;
  std::__cxx11::string::string(this_00);
  bVar2 = ThreadSafeIterIndex::TryGetError
                    (in_stack_fffffffffffffe58,(string *)in_stack_fffffffffffffe50);
  line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe3c);
  if (bVar2) {
    std::__cxx11::string::c_str();
    Throw((char *)in_stack_fffffffffffffe40,line);
  }
  std::__cxx11::string::~string(local_170);
  std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
            ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)this_00);
  ThreadSafeIterIndex::~ThreadSafeIterIndex((ThreadSafeIterIndex *)0x1788ed);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffe40);
  std::vector<PerThreadData,_std::allocator<PerThreadData>_>::~vector
            ((vector<PerThreadData,_std::allocator<PerThreadData>_> *)in_stack_fffffffffffffe40);
  return;
}

Assistant:

void Bloaty::ScanAndRollupFiles(const std::vector<std::string>& filenames,
                                std::vector<std::string>* build_ids,
                                Rollup* rollup) const {
  int num_cpus = std::thread::hardware_concurrency();
  int num_threads = std::min(num_cpus, static_cast<int>(filenames.size()));

  struct PerThreadData {
    Rollup rollup;
    std::vector<std::string> build_ids;
  };

  std::vector<PerThreadData> thread_data(num_threads);
  std::vector<std::thread> threads(num_threads);
  ThreadSafeIterIndex index(filenames.size());

  std::unique_ptr<ReImpl> regex = nullptr;
  if (options_.has_source_filter()) {
    regex = absl::make_unique<ReImpl>(options_.source_filter());
  }

  for (int i = 0; i < num_threads; i++) {
    thread_data[i].rollup.SetFilterRegex(regex.get());

    threads[i] = std::thread(
        [this, &index, &filenames](PerThreadData* data) {
          try {
            int j;
            while (index.TryGetNext(&j)) {
              ScanAndRollupFile(filenames[j], &data->rollup, &data->build_ids);
            }
          } catch (const bloaty::Error& e) {
            index.Abort(e.what());
          }
        },
        &thread_data[i]);
  }

  for (int i = 0; i < num_threads; i++) {
    threads[i].join();
    PerThreadData* data = &thread_data[i];
    if (i == 0) {
      *rollup = std::move(data->rollup);
    } else {
      rollup->Add(data->rollup);
    }

    build_ids->insert(build_ids->end(), data->build_ids.begin(),
                      data->build_ids.end());
  }

  std::string error;
  if (index.TryGetError(&error)) {
    THROW(error.c_str());
  }
}